

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall Instance::type_abi_cxx11_(Instance *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x18));
  return in_RDI;
}

Assistant:

std::string Instance::type() const {
    return _type;
}